

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

void rdr_load(rdr_t *rdr,FILE *file)

{
  uint32_t *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  pat_t **pppVar5;
  char *p;
  pat_t *ppVar6;
  __int32_t **pp_Var7;
  ulong uVar8;
  int autouni;
  fpos_t pos;
  uint local_3c;
  fpos_t local_38;
  
  local_3c = (uint)rdr->autouni;
  fgetpos((FILE *)file,&local_38);
  puVar1 = &rdr->npats;
  iVar4 = __isoc99_fscanf(file,"#rdr#%u/%u/%d\n",puVar1,&rdr->ntoks,&local_3c);
  if (iVar4 != 3) {
    fsetpos((FILE *)file,&local_38);
    iVar4 = __isoc99_fscanf(file,"#rdr#%u/%u\n",puVar1,&rdr->ntoks);
    if (iVar4 != 2) {
      fatal("broken file, invalid reader format");
    }
  }
  rdr->autouni = local_3c != 0;
  rdr->nuni = 0;
  rdr->nbi = 0;
  if ((ulong)rdr->npats != 0) {
    pppVar5 = (pat_t **)xmalloc((ulong)rdr->npats << 3);
    rdr->pats = pppVar5;
    if (rdr->npats != 0) {
      uVar8 = 0;
      do {
        p = ns_readstr(file);
        ppVar6 = pat_comp(p);
        rdr->pats[uVar8] = ppVar6;
        pp_Var7 = __ctype_tolower_loc();
        iVar4 = (*pp_Var7)[*p];
        if (iVar4 == 0x2a) {
          uVar2 = rdr->nuni;
          uVar3 = rdr->nbi;
          rdr->nuni = uVar2 + 1;
          rdr->nbi = uVar3 + 1;
        }
        else if (iVar4 == 0x62) {
          rdr->nbi = rdr->nbi + 1;
        }
        else if (iVar4 == 0x75) {
          rdr->nuni = rdr->nuni + 1;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < *puVar1);
    }
  }
  qrk_load(rdr->lbl,file);
  qrk_load(rdr->obs,file);
  return;
}

Assistant:

void rdr_load(rdr_t *rdr, FILE *file) {
	const char *err = "broken file, invalid reader format";
	int autouni = rdr->autouni;
	fpos_t pos;
	fgetpos(file, &pos);
	if (fscanf(file, "#rdr#%"PRIu32"/%"PRIu32"/%d\n",
			&rdr->npats, &rdr->ntoks, &autouni) != 3) {
		// This for compatibility with previous file format
		fsetpos(file, &pos);
		if (fscanf(file, "#rdr#%"PRIu32"/%"PRIu32"\n",
				&rdr->npats, &rdr->ntoks) != 2)
			fatal(err);
	}
	rdr->autouni = autouni;
	rdr->nuni = rdr->nbi = 0;
	if (rdr->npats != 0) {
		rdr->pats = xmalloc(sizeof(pat_t *) * rdr->npats);
		for (uint32_t p = 0; p < rdr->npats; p++) {
			char *pat = ns_readstr(file);
			rdr->pats[p] = pat_comp(pat);
			switch (tolower(pat[0])) {
				case 'u': rdr->nuni++; break;
				case 'b': rdr->nbi++;  break;
				case '*': rdr->nuni++;
				          rdr->nbi++;  break;
			}
		}
	}
	qrk_load(rdr->lbl, file);
	qrk_load(rdr->obs, file);
}